

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

string * testing::internal::JsonUnitTestResultPrinter::TestPropertiesAsJson
                   (string *__return_storage_ptr__,TestResult *result,string *indent)

{
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var1;
  string *psVar2;
  TestProperty *pTVar3;
  size_t sVar4;
  pointer *__ptr;
  int i;
  char *__s;
  Message attributes;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_88;
  allocator<char> local_79;
  string local_78;
  string *local_58;
  string local_50;
  
  local_58 = __return_storage_ptr__;
  Message::Message((Message *)&local_88);
  if (0 < (int)((ulong)((long)(result->test_properties_).
                              super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(result->test_properties_).
                             super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 6)) {
    i = 0;
    do {
      pTVar3 = TestResult::GetTestProperty(result,i);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_88._M_head_impl + 0x10),",\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_88._M_head_impl + 0x10),(indent->_M_dataplus)._M_p,
                 indent->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_88._M_head_impl + 0x10),"\"",1);
      _Var1._M_head_impl = local_88._M_head_impl;
      __s = (pTVar3->key_)._M_dataplus._M_p;
      if (__s == (char *)0x0) {
        sVar4 = 6;
        __s = "(null)";
      }
      else {
        sVar4 = strlen(__s);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(_Var1._M_head_impl + 0x10),__s,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_88._M_head_impl + 0x10),"\": ",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_88._M_head_impl + 0x10),"\"",1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,(pTVar3->value_)._M_dataplus._M_p,&local_79);
      EscapeJson(&local_78,&local_50);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_88._M_head_impl + 0x10),local_78._M_dataplus._M_p,
                 local_78._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_88._M_head_impl + 0x10),"\"",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      i = i + 1;
    } while (i < (int)((ulong)((long)(result->test_properties_).
                                     super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(result->test_properties_).
                                    super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 6));
  }
  psVar2 = local_58;
  StringStreamToString(local_58,local_88._M_head_impl);
  if (local_88._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)local_88._M_head_impl + 8))();
  }
  return psVar2;
}

Assistant:

std::string JsonUnitTestResultPrinter::TestPropertiesAsJson(
    const TestResult& result, const std::string& indent) {
  Message attributes;
  for (int i = 0; i < result.test_property_count(); ++i) {
    const TestProperty& property = result.GetTestProperty(i);
    attributes << ",\n" << indent << "\"" << property.key() << "\": "
               << "\"" << EscapeJson(property.value()) << "\"";
  }
  return attributes.GetString();
}